

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_read_frame_cb(nni_ws *ws,ws_frame *frame)

{
  ws_frame *frame_local;
  nni_ws *ws_local;
  
  switch(frame->op) {
  case WS_CONT:
    if ((ws->inmsg & 1U) == 0) {
      ws_close(ws,0x3ea);
      return;
    }
    if ((frame->final & 1U) != 0) {
      ws->inmsg = false;
    }
    ws->rxframe = (ws_frame *)0x0;
    nni_list_append(&ws->rxq,frame);
    break;
  case WS_TEXT:
    if ((ws->recv_text & 1U) == 0) {
      ws_close(ws,0x3eb);
    }
  case WS_BINARY:
    if ((ws->inmsg & 1U) != 0) {
      ws_close(ws,0x3ea);
      return;
    }
    if ((frame->final & 1U) == 0) {
      ws->inmsg = true;
    }
    ws->rxframe = (ws_frame *)0x0;
    nni_list_append(&ws->rxq,frame);
    break;
  default:
    ws_close(ws,0x3ea);
    return;
  case WS_CLOSE:
    ws->peer_closed = true;
    if ((ws->closed & 1U) == 0) {
      ws_close(ws,1000);
      return;
    }
    ws->wclose = false;
    nni_aio_finish(&ws->closeaio,NNG_OK,0);
    return;
  case WS_PING:
    if (0x7d < frame->len) {
      ws_close(ws,0x3ea);
      return;
    }
    ws_send_control(ws,'\n',frame->buf,frame->len);
    ws->rxframe = (ws_frame *)0x0;
    ws_frame_fini(frame);
    break;
  case WS_PONG:
    if (0x7d < frame->len) {
      ws_close(ws,0x3ea);
      return;
    }
    ws->rxframe = (ws_frame *)0x0;
    ws_frame_fini(frame);
  }
  ws_read_finish(ws);
  return;
}

Assistant:

static void
ws_read_frame_cb(nni_ws *ws, ws_frame *frame)
{
	switch (frame->op) {
	case WS_CONT:
		if (!ws->inmsg) {
			ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
			return;
		}
		if (frame->final) {
			ws->inmsg = false;
		}
		ws->rxframe = NULL;
		nni_list_append(&ws->rxq, frame);
		break;
	case WS_TEXT:
		if (!ws->recv_text) {
			// No support for text mode at present.
			ws_close(ws, WS_CLOSE_UNSUPP_FORMAT);
		}
		// FALLTHROUGH
	case WS_BINARY:
		if (ws->inmsg) {
			ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
			return;
		}
		if (!frame->final) {
			ws->inmsg = true;
		}
		ws->rxframe = NULL;
		nni_list_append(&ws->rxq, frame);
		break;

	case WS_PING:
		if (frame->len > 125) {
			ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
			return;
		}
		ws_send_control(ws, WS_PONG, frame->buf, frame->len);
		ws->rxframe = NULL;
		ws_frame_fini(frame);
		break;
	case WS_PONG:
		if (frame->len > 125) {
			ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
			return;
		}
		ws->rxframe = NULL;
		ws_frame_fini(frame);
		break;
	case WS_CLOSE:
		// if we did not send a close frame yet, do so.
		// (this might be a response to our close)
		ws->peer_closed = true;
		if (!ws->closed) {
			ws_close(ws, WS_CLOSE_NORMAL_CLOSE);
		} else {
			ws->wclose = false;
			nni_aio_finish(&ws->closeaio, 0, 0);
		}
		return;
	default:
		ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
		return;
	}

	ws_read_finish(ws);
}